

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

handle pybind11::detail::type_caster_generic::cast
                 (void *_src,return_value_policy policy,handle parent,type_info *tinfo,
                 _func_void_ptr_void_ptr *copy_constructor,_func_void_ptr_void_ptr *move_constructor
                 ,void *existing_holder)

{
  bool bVar1;
  internals *piVar2;
  pointer ppVar3;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *this;
  reference pptVar4;
  handle *phVar5;
  PyObject *ptr;
  PyObject **ppPVar6;
  value_and_holder *this_00;
  void *pvVar7;
  cast_error *pcVar8;
  values_and_holders local_100;
  iterator local_f0;
  void **local_c0;
  void **valueptr;
  instance *wrapper;
  handle local_a8;
  object inst;
  type_info *instance_type;
  const_iterator __end3;
  const_iterator __begin3;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *__range3;
  _Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false> it_i;
  pair<std::__detail::_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>_>
  it_instances;
  object local_50;
  void *local_48;
  void *src;
  _func_void_ptr_void_ptr *move_constructor_local;
  _func_void_ptr_void_ptr *copy_constructor_local;
  type_info *tinfo_local;
  void *pvStack_20;
  return_value_policy policy_local;
  void *_src_local;
  handle parent_local;
  
  src = move_constructor;
  move_constructor_local = copy_constructor;
  copy_constructor_local = (_func_void_ptr_void_ptr *)tinfo;
  tinfo_local._7_1_ = policy;
  pvStack_20 = _src;
  _src_local = parent.m_ptr;
  if (tinfo == (type_info *)0x0) {
    memset(&parent_local,0,8);
    pybind11::handle::handle(&parent_local);
  }
  else {
    local_48 = _src;
    if (_src == (void *)0x0) {
      none::none((none *)&local_50);
      parent_local = object::release(&local_50);
      none::~none((none *)&local_50);
    }
    else {
      piVar2 = get_internals();
      _it_i = std::
              unordered_multimap<const_void_*,_pybind11::detail::instance_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_pybind11::detail::instance_*>_>_>
              ::equal_range(&piVar2->registered_instances,&local_48);
      __range3 = (vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                  *)it_i.
                    super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                    ._M_cur;
      while (bVar1 = std::__detail::operator!=
                               ((_Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                                 *)&__range3,
                                (_Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                                 *)&it_instances), bVar1) {
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>
                               *)&__range3);
        this = all_type_info((ppVar3->second->ob_base).ob_type);
        __end3 = std::
                 vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                 ::begin(this);
        instance_type =
             (type_info *)
             std::
             vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>::
             end(this);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<pybind11::detail::type_info_*const_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>
                                           *)&instance_type), bVar1) {
          pptVar4 = __gnu_cxx::
                    __normal_iterator<pybind11::detail::type_info_*const_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>
                    ::operator*(&__end3);
          if ((*pptVar4 != (type_info *)0x0) &&
             (bVar1 = same_type((*pptVar4)->cpptype,*(type_info **)(copy_constructor_local + 8)),
             bVar1)) {
            ppVar3 = std::__detail::
                     _Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>
                     ::operator->((_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>
                                   *)&__range3);
            pybind11::handle::handle(&inst.super_handle,&ppVar3->second->ob_base);
            phVar5 = pybind11::handle::inc_ref(&inst.super_handle);
            return (handle)phVar5->m_ptr;
          }
          __gnu_cxx::
          __normal_iterator<pybind11::detail::type_info_*const_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>
          ::operator++(&__end3);
        }
        std::__detail::
        _Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>::
        operator++((_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>
                    *)&__range3);
      }
      ptr = make_new_instance(*(PyTypeObject **)copy_constructor_local);
      pybind11::handle::handle((handle *)&wrapper,ptr);
      reinterpret_steal<pybind11::object>((pybind11 *)&local_a8,(handle)wrapper);
      ppPVar6 = pybind11::handle::ptr(&local_a8);
      valueptr = (void **)*ppPVar6;
      ((instance *)valueptr)->field_0x30 = ((instance *)valueptr)->field_0x30 & 0xfe;
      values_and_holders::values_and_holders(&local_100,(instance *)valueptr);
      values_and_holders::begin(&local_f0,&local_100);
      this_00 = values_and_holders::iterator::operator->(&local_f0);
      local_c0 = value_and_holder::value_ptr<void>(this_00);
      switch(tinfo_local._7_1_) {
      case automatic:
      case take_ownership:
        *local_c0 = local_48;
        *(byte *)(valueptr + 6) = *(byte *)(valueptr + 6) & 0xfe | 1;
        break;
      case automatic_reference:
      case reference:
        *local_c0 = local_48;
        *(byte *)(valueptr + 6) = *(byte *)(valueptr + 6) & 0xfe;
        break;
      case copy:
        if (move_constructor_local == (_func_void_ptr_void_ptr *)0x0) {
          pcVar8 = (cast_error *)__cxa_allocate_exception(0x10);
          cast_error::runtime_error
                    (pcVar8,"return_value_policy = copy, but the object is non-copyable!");
          __cxa_throw(pcVar8,&cast_error::typeinfo,cast_error::~cast_error);
        }
        pvVar7 = (*move_constructor_local)(local_48);
        *local_c0 = pvVar7;
        *(byte *)(valueptr + 6) = *(byte *)(valueptr + 6) & 0xfe | 1;
        break;
      case move:
        if (src == (void *)0x0) {
          if (move_constructor_local == (_func_void_ptr_void_ptr *)0x0) {
            pcVar8 = (cast_error *)__cxa_allocate_exception(0x10);
            cast_error::runtime_error
                      (pcVar8,
                       "return_value_policy = move, but the object is neither movable nor copyable!"
                      );
            __cxa_throw(pcVar8,&cast_error::typeinfo,cast_error::~cast_error);
          }
          pvVar7 = (*move_constructor_local)(local_48);
          *local_c0 = pvVar7;
        }
        else {
          pvVar7 = (void *)(*(code *)src)(local_48);
          *local_c0 = pvVar7;
        }
        *(byte *)(valueptr + 6) = *(byte *)(valueptr + 6) & 0xfe | 1;
        break;
      case reference_internal:
        *local_c0 = local_48;
        *(byte *)(valueptr + 6) = *(byte *)(valueptr + 6) & 0xfe;
        keep_alive_impl(local_a8,(handle)_src_local);
        break;
      default:
        pcVar8 = (cast_error *)__cxa_allocate_exception(0x10);
        cast_error::runtime_error(pcVar8,"unhandled return_value_policy: should not happen!");
        __cxa_throw(pcVar8,&cast_error::typeinfo,cast_error::~cast_error);
      }
      (**(code **)(copy_constructor_local + 0x30))(valueptr,existing_holder);
      parent_local = object::release((object *)&local_a8);
      object::~object((object *)&local_a8);
    }
  }
  return (handle)parent_local.m_ptr;
}

Assistant:

PYBIND11_NOINLINE static handle cast(const void *_src, return_value_policy policy, handle parent,
                                         const detail::type_info *tinfo,
                                         void *(*copy_constructor)(const void *),
                                         void *(*move_constructor)(const void *),
                                         const void *existing_holder = nullptr) {
        if (!tinfo) // no type info: error will be set already
            return handle();

        void *src = const_cast<void *>(_src);
        if (src == nullptr)
            return none().release();

        auto it_instances = get_internals().registered_instances.equal_range(src);
        for (auto it_i = it_instances.first; it_i != it_instances.second; ++it_i) {
            for (auto instance_type : detail::all_type_info(Py_TYPE(it_i->second))) {
                if (instance_type && same_type(*instance_type->cpptype, *tinfo->cpptype))
                    return handle((PyObject *) it_i->second).inc_ref();
            }
        }

        auto inst = reinterpret_steal<object>(make_new_instance(tinfo->type));
        auto wrapper = reinterpret_cast<instance *>(inst.ptr());
        wrapper->owned = false;
        void *&valueptr = values_and_holders(wrapper).begin()->value_ptr();

        switch (policy) {
            case return_value_policy::automatic:
            case return_value_policy::take_ownership:
                valueptr = src;
                wrapper->owned = true;
                break;

            case return_value_policy::automatic_reference:
            case return_value_policy::reference:
                valueptr = src;
                wrapper->owned = false;
                break;

            case return_value_policy::copy:
                if (copy_constructor)
                    valueptr = copy_constructor(src);
                else
                    throw cast_error("return_value_policy = copy, but the "
                                     "object is non-copyable!");
                wrapper->owned = true;
                break;

            case return_value_policy::move:
                if (move_constructor)
                    valueptr = move_constructor(src);
                else if (copy_constructor)
                    valueptr = copy_constructor(src);
                else
                    throw cast_error("return_value_policy = move, but the "
                                     "object is neither movable nor copyable!");
                wrapper->owned = true;
                break;

            case return_value_policy::reference_internal:
                valueptr = src;
                wrapper->owned = false;
                keep_alive_impl(inst, parent);
                break;

            default:
                throw cast_error("unhandled return_value_policy: should not happen!");
        }

        tinfo->init_instance(wrapper, existing_holder);

        return inst.release();
    }